

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall deqp::egl::Image::ImageFormatCase::deinit(ImageFormatCase *this)

{
  Library *pLVar1;
  size_type sVar2;
  reference ppIVar3;
  int local_1c;
  int contexNdx;
  Library *egl;
  ImageFormatCase *this_local;
  
  pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>
            ::size(&this->m_apiContexts);
    if ((int)sVar2 <= local_1c) break;
    ppIVar3 = std::
              vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>::
              operator[](&this->m_apiContexts,(long)local_1c);
    if (*ppIVar3 != (value_type)0x0) {
      (*(*ppIVar3)->_vptr_ImageApi[1])();
    }
    local_1c = local_1c + 1;
  }
  std::vector<deqp::egl::Image::ImageApi_*,_std::allocator<deqp::egl::Image::ImageApi_*>_>::clear
            (&this->m_apiContexts);
  if (this->m_surface != (EGLSurface)0x0) {
    (*pLVar1->_vptr_Library[0x16])(pLVar1,this->m_display,this->m_surface);
    this->m_surface = (EGLSurface)0x0;
  }
  if (this->m_window != (NativeWindow *)0x0) {
    (*this->m_window->_vptr_NativeWindow[1])();
  }
  this->m_window = (NativeWindow *)0x0;
  if (this->m_display != (EGLDisplay)0x0) {
    (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void ImageFormatCase::deinit (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	for (int contexNdx = 0 ; contexNdx < (int)m_apiContexts.size(); contexNdx++)
		delete m_apiContexts[contexNdx];

	m_apiContexts.clear();

	if (m_surface != EGL_NO_SURFACE)
	{
		egl.destroySurface(m_display, m_surface);
		m_surface = EGL_NO_SURFACE;
	}

	delete m_window;
	m_window = DE_NULL;

	if (m_display != EGL_NO_DISPLAY)
	{
		egl.terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}